

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

void f_luaopen(lua_State *L,void *ud)

{
  global_State *pgVar1;
  Table *t;
  lua_Number *plVar2;
  lua_State *x__1;
  TValue *io;
  Table *x_;
  Value local_38;
  undefined4 local_30;
  
  pgVar1 = L->l_G;
  stack_init(L,L);
  t = luaH_new(L);
  (pgVar1->l_registry).value_.gc = (GCObject *)t;
  (pgVar1->l_registry).tt_ = 0x45;
  luaH_resize(L,t,2,0);
  local_30 = 0x48;
  local_38 = (Value)L;
  luaH_setint(L,t,1,(TValue *)&local_38);
  local_38.gc = (GCObject *)luaH_new(L);
  local_30 = 0x45;
  luaH_setint(L,t,2,(TValue *)&local_38);
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  pgVar1->gcrunning = '\x01';
  plVar2 = lua_version((lua_State *)0x0);
  pgVar1->version = plVar2;
  return;
}

Assistant:

static void f_luaopen (lua_State *L, void *ud) {
  global_State *g = G(L);
  UNUSED(ud);
  stack_init(L, L);  /* init stack */
  init_registry(L, g);
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  g->gcrunning = 1;  /* allow gc */
  g->version = lua_version(NULL);
  luai_userstateopen(L);
}